

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O1

UBool __thiscall
icu_63::Normalizer2Impl::hasCompBoundaryBefore(Normalizer2Impl *this,UChar *src,UChar *limit)

{
  UChar UVar1;
  UChar UVar2;
  ushort uVar3;
  UCPTrie *trie;
  bool bVar4;
  int iVar5;
  
  bVar4 = true;
  if ((src != limit) && (UVar1 = *src, (ushort)this->minCompNoMaybeCP <= (ushort)UVar1)) {
    if ((UVar1 & 0xf800U) == 0xd800) {
      if ((src + 1 == limit || ((byte)((ushort)UVar1 >> 10) & 1) != 0) ||
         (UVar2 = src[1], (UVar2 & 0xfc00U) != 0xdc00)) {
        iVar5 = this->normTrie->dataLength + -1;
      }
      else {
        iVar5 = (uint)(ushort)UVar1 * 0x400 + (uint)(ushort)UVar2 + -0x35fdc00;
        trie = this->normTrie;
        if (iVar5 < trie->highStart) {
          iVar5 = ucptrie_internalSmallIndex_63(trie,iVar5);
        }
        else {
          iVar5 = trie->dataLength + -2;
        }
      }
    }
    else {
      iVar5 = ((ushort)UVar1 & 0x3f) + (uint)this->normTrie->index[(ushort)UVar1 >> 6];
    }
    uVar3 = *(ushort *)((long)(this->normTrie->data).ptr0 + (long)iVar5 * 2);
    if (this->minNoNoCompNoMaybeCC <= uVar3) {
      bVar4 = uVar3 < this->minMaybeYes && this->limitNoNo <= uVar3;
    }
  }
  return bVar4;
}

Assistant:

UBool Normalizer2Impl::hasCompBoundaryBefore(const UChar *src, const UChar *limit) const {
    if (src == limit || *src < minCompNoMaybeCP) {
        return TRUE;
    }
    UChar32 c;
    uint16_t norm16;
    UCPTRIE_FAST_U16_NEXT(normTrie, UCPTRIE_16, src, limit, c, norm16);
    return norm16HasCompBoundaryBefore(norm16);
}